

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool ReadObject(HSQUIRRELVM v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *o)

{
  bool bVar1;
  SQChar *pSVar2;
  undefined4 *in_RCX;
  SQSharedState *in_RDX;
  HSQUIRRELVM in_RSI;
  SQVM *in_RDI;
  SQFloat f;
  SQInteger i_1;
  SQInteger i;
  SQInteger len;
  SQObjectType t;
  SQUnsignedInteger32 _type;
  SQInteger in_stack_ffffffffffffff88;
  SQObjectPtr *in_stack_ffffffffffffff90;
  SQSharedState *len_00;
  SQUserPointer in_stack_ffffffffffffff98;
  SQVM *x;
  SQWRITEFUNC in_stack_ffffffffffffffa0;
  HSQUIRRELVM in_stack_ffffffffffffffa8;
  undefined8 local_48;
  SQObjectType local_2c;
  
  bVar1 = SafeRead(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (!bVar1) {
    return false;
  }
  if (local_2c == OT_NULL) {
    SQObjectPtr::Null(in_stack_ffffffffffffff90);
  }
  else if (local_2c == OT_BOOL) {
    bVar1 = SafeRead(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    *in_RCX = 0x1000008;
    *(undefined8 *)(in_RCX + 2) = local_48;
  }
  else if (local_2c == OT_INTEGER) {
    bVar1 = SafeRead(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    SQObjectPtr::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else if (local_2c == OT_FLOAT) {
    bVar1 = SafeRead(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    SQObjectPtr::operator=
              (in_stack_ffffffffffffff90,(SQFloat)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  }
  else {
    if (local_2c != OT_STRING) {
      pSVar2 = IdType2Name(local_2c);
      SQVM::Raise_Error(in_RDI,"cannot serialize a %s",pSVar2);
      return false;
    }
    bVar1 = SafeRead(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    x = in_RDI;
    SQSharedState::GetScratchPad(in_RDX,(SQInteger)in_RDI);
    bVar1 = SafeRead(in_RSI,(SQWRITEFUNC)in_RDX,x,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    len_00 = in_RDI->_sharedstate;
    SQSharedState::GetScratchPad(in_RDX,(SQInteger)x);
    SQString::Create(in_RDX,(SQChar *)x,(SQInteger)len_00);
    SQObjectPtr::operator=((SQObjectPtr *)in_RDX,(SQString *)x);
  }
  return true;
}

Assistant:

bool ReadObject(HSQUIRRELVM v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &o)
{
    SQUnsignedInteger32 _type;
    _CHECK_IO(SafeRead(v,read,up,&_type,sizeof(_type)));
    SQObjectType t = (SQObjectType)_type;
    switch(t){
    case OT_STRING:{
        SQInteger len;
        _CHECK_IO(SafeRead(v,read,up,&len,sizeof(SQInteger)));
        _CHECK_IO(SafeRead(v,read,up,_ss(v)->GetScratchPad(sq_rsl(len)),sq_rsl(len)));
        o=SQString::Create(_ss(v),_ss(v)->GetScratchPad(-1),len);
                   }
        break;
    case OT_INTEGER:{
        SQInteger i;
        _CHECK_IO(SafeRead(v,read,up,&i,sizeof(SQInteger))); o = i; break;
                    }
    case OT_BOOL:{
        SQInteger i;
        _CHECK_IO(SafeRead(v,read,up,&i,sizeof(SQInteger))); o._type = OT_BOOL; o._unVal.nInteger = i; break;
                    }
    case OT_FLOAT:{
        SQFloat f;
        _CHECK_IO(SafeRead(v,read,up,&f,sizeof(SQFloat))); o = f; break;
                  }
    case OT_NULL:
        o.Null();
        break;
    default:
        v->Raise_Error(_SC("cannot serialize a %s"),IdType2Name(t));
        return false;
    }
    return true;
}